

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O0

ostream * operator<<(ostream *os,BigInt *x)

{
  BigInt local_38;
  BigInt *local_18;
  BigInt *x_local;
  ostream *os_local;
  
  local_18 = x;
  x_local = (BigInt *)os;
  BigInt::to_string_abi_cxx11_(&local_38);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)x_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, BigInt& x) {
    os << x.to_string();
    return os;
}